

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QString * __thiscall QAuthenticator::user(QAuthenticator *this)

{
  long *in_RSI;
  QString *in_RDI;
  
  if (*in_RSI == 0) {
    QString::QString((QString *)0x204fea);
  }
  else {
    QString::QString(in_RDI,in_RDI);
  }
  return in_RDI;
}

Assistant:

QString QAuthenticator::user() const
{
    return d ? d->user : QString();
}